

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  int iVar1;
  string *value;
  EnumValueDescriptor *this_00;
  EnumValueDescriptorProto *proto_00;
  EnumOptions *pEVar2;
  EnumOptions *pEVar3;
  undefined4 local_1c;
  int i;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *this_local;
  
  value = name_abi_cxx11_(this);
  EnumDescriptorProto::set_name(proto,value);
  local_1c = 0;
  while( true ) {
    iVar1 = value_count(this);
    if (iVar1 <= local_1c) break;
    this_00 = EnumDescriptor::value(this,local_1c);
    proto_00 = EnumDescriptorProto::add_value(proto);
    EnumValueDescriptor::CopyTo(this_00,proto_00);
    local_1c = local_1c + 1;
  }
  pEVar2 = options(this);
  pEVar3 = EnumOptions::default_instance();
  if (pEVar2 != pEVar3) {
    pEVar2 = EnumDescriptorProto::mutable_options(proto);
    pEVar3 = options(this);
    EnumOptions::CopyFrom(pEVar2,pEVar3);
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}